

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  Module nasmModule;
  Stats stats;
  Module irModule;
  ofstream dumpIR;
  
  uVar3 = 0;
  uVar5 = 0;
  if (0 < argc) {
    uVar5 = (ulong)(uint)argc;
  }
  bVar4 = 0;
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dumpIR,argv[uVar3],(allocator<char> *)&irModule);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &dumpIR,"--semantic");
    std::__cxx11::string::~string((string *)&dumpIR);
    bVar4 = bVar4 | bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dumpIR,argv[1],(allocator<char> *)&nasmModule);
  runFrontend(&irModule,(string *)&dumpIR);
  std::__cxx11::string::~string((string *)&dumpIR);
  if (bVar4 == 0) {
    stats.module = &irModule;
    sVar2 = mocker::ir::Stats::countInsts<mocker::ir::Phi>(&stats);
    if (sVar2 != 0) {
      __assert_fail("stats.countInsts<mocker::ir::Phi>() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/main.cpp"
                    ,0x41,"int main(int, char **)");
    }
    optimize(&irModule);
    if (2 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nasmModule,argv[2],(allocator<char> *)&dumpIR);
      std::ofstream::ofstream(&dumpIR,(string *)&nasmModule,_S_out);
      mocker::ir::printModule(&irModule,(ostream *)&dumpIR);
      std::ofstream::~ofstream(&dumpIR);
      std::__cxx11::string::~string((string *)&nasmModule);
    }
    codegen(&nasmModule,&irModule);
    if (argc < 4) {
      mocker::nasm::printModule(&nasmModule,(ostream *)&std::cout);
    }
    else {
      std::ofstream::ofstream(&dumpIR,argv[3],_S_out);
      mocker::nasm::printModule(&nasmModule,(ostream *)&dumpIR);
      std::ofstream::close();
      std::ofstream::~ofstream(&dumpIR);
    }
    mocker::nasm::Module::~Module(&nasmModule);
  }
  mocker::ir::Module::~Module(&irModule);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  bool semanticOnly = false;
  for (int i = 0; i < argc; ++i) {
    if (std::string(argv[i]) == "--semantic")
      semanticOnly = true;
  }

  auto irModule = runFrontend(argv[1]);

  if (semanticOnly)
    return 0;

  mocker::ir::Stats stats(irModule);
  assert(stats.countInsts<mocker::ir::Phi>() == 0);

  optimize(irModule);

  if (argc >= 3) {
    std::string irPath = argv[2];
    std::ofstream dumpIR(irPath);
    mocker::ir::printModule(irModule, dumpIR);
  }

  auto nasmModule = codegen(irModule);
  if (argc >= 4) {
    std::ofstream fout(argv[3]);
    mocker::nasm::printModule(nasmModule, fout);
    fout.close();
  } else {
    mocker::nasm::printModule(nasmModule, std::cout);
  }

  return 0;
}